

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O1

ssize_t __thiscall
TestWaitingLogSink::send(TestWaitingLogSink *this,int __fd,void *__buf,size_t __n,int __flags)

{
  pthread_t __thread1;
  int iVar1;
  pthread_t __thread2;
  undefined4 extraout_var;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  int in_R9D;
  tm *in_stack_00000008;
  char *in_stack_00000010;
  _Alloc_hider in_stack_ffffffffffffffb0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  __thread1 = this->tid_;
  __thread2 = pthread_self();
  iVar1 = pthread_equal(__thread1,__thread2);
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT44(extraout_var,iVar1);
  if (iVar1 != 0) {
    google::LogSink::ToString_abi_cxx11_
              ((string *)&stack0xffffffffffffffb0,(LogSink *)(ulong)(uint)__fd,(LogSeverity)__n,
               (char *)(ulong)(uint)__flags,in_R9D,in_stack_00000008,in_stack_00000010,
               (size_t)in_stack_ffffffffffffffb0._M_p);
    TestLogSinkWriter::Buffer(&this->writer_,(string *)&stack0xffffffffffffffb0);
    paVar2 = &local_40;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffb0._M_p != paVar2) {
      operator_delete(in_stack_ffffffffffffffb0._M_p,local_40._M_allocated_capacity + 1);
      paVar2 = extraout_RAX;
    }
  }
  return (ssize_t)paVar2;
}

Assistant:

virtual void send(LogSeverity severity, const char* /* full_filename */,
                    const char* base_filename, int line,
                    const struct tm* tm_time,
                    const char* message, size_t message_len) {
    // Push it to Writer thread if we are the original logging thread.
    // Note: Something like ThreadLocalLogSink is a better choice
    //       to do thread-specific LogSink logic for real.
    if (pthread_equal(tid_, pthread_self())) {
      writer_.Buffer(ToString(severity, base_filename, line,
                              tm_time, message, message_len));
    }
  }